

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

bool ON_SubDEdgeSharpness::EqualDelta(ON_SubDEdgeSharpness s0,ON_SubDEdgeSharpness s1)

{
  double dVar1;
  byte bVar2;
  float fVar3;
  float fVar5;
  double dVar4;
  float fVar6;
  
  fVar3 = s0.m_edge_sharpness[0];
  fVar5 = s0.m_edge_sharpness[1];
  fVar6 = s1.m_edge_sharpness[0];
  if ((fVar5 != fVar6) || (NAN(fVar5) || NAN(fVar6))) {
    bVar2 = 0;
  }
  else {
    dVar1 = (double)fVar5 - (double)fVar3;
    if ((fVar3 == fVar5) && (!NAN(fVar3) && !NAN(fVar5))) {
      dVar1 = 0.0;
    }
    fVar3 = s1.m_edge_sharpness[1];
    dVar4 = (double)fVar3 - (double)fVar6;
    if ((fVar6 == fVar3) && (!NAN(fVar6) && !NAN(fVar3))) {
      dVar4 = 0.0;
    }
    if (((dVar1 == 0.0) && (!NAN(dVar1))) || ((dVar4 == 0.0 && (!NAN(dVar4))))) {
      bVar2 = -(dVar1 == 0.0) & -(dVar4 == 0.0);
    }
    else {
      bVar2 = ABS(dVar1 - dVar4) <= 0.01;
    }
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool ON_SubDEdgeSharpness::EqualDelta(
  ON_SubDEdgeSharpness s0,
  ON_SubDEdgeSharpness s1
)
{
  if (false == (s0.m_edge_sharpness[1] == s1.m_edge_sharpness[0]))
    return false;
  
  const double delta0 = s0.Delta();
  const double delta1 = s1.Delta();

  if (0.0 != delta0 && 0.0 != delta1)
  {
    // fuzzy compare for nonzero deltas
    const double d = fabs(delta0 - delta1);
    return (d <= ON_SubDEdgeSharpness::Tolerance);
  }

  // strict compare for zero deltas.
  return 0.0 == delta0 && 0.0 == delta1;
}